

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_completions.cc
# Opt level: O0

int __thiscall google::anon_unknown_2::DisplayInfoGroup::SizeInLines(DisplayInfoGroup *this)

{
  size_type sVar1;
  size_t sVar2;
  int local_14;
  int size_in_lines;
  DisplayInfoGroup *this_local;
  
  sVar1 = std::
          set<const_google::CommandLineFlagInfo_*,_std::less<const_google::CommandLineFlagInfo_*>,_std::allocator<const_google::CommandLineFlagInfo_*>_>
          ::size(this->group);
  local_14 = (int)sVar1 + 1;
  sVar2 = strlen(this->header);
  if (sVar2 != 0) {
    local_14 = (int)sVar1 + 2;
  }
  sVar2 = strlen(this->footer);
  if (sVar2 != 0) {
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

int SizeInLines() const {
    int size_in_lines = static_cast<int>(group->size()) + 1;
    if (strlen(header) > 0) {
      size_in_lines++;
    }
    if (strlen(footer) > 0) {
      size_in_lines++;
    }
    return size_in_lines;
  }